

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::~cmXMLWriter(cmXMLWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (this->Indent == 0) {
    pcVar2 = (this->IndentationElement)._M_dataplus._M_p;
    paVar1 = &(this->IndentationElement).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->Elements).c);
    return;
  }
  __assert_fail("this->Indent == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmXMLWriter.cxx"
                ,0x15,"cmXMLWriter::~cmXMLWriter()");
}

Assistant:

cmXMLWriter::~cmXMLWriter()
{
  assert(this->Indent == 0);
}